

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O2

void __thiscall
nonius::standard_reporter::print_statistic_estimate
          (standard_reporter *this,char *name,
          estimate<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> estimate)

{
  function<std::basic_ostream<char,_std::char_traits<char>_>_&()> *this_00;
  basic_ostream<char,_std::char_traits<char>_> *pbVar1;
  ostream *poVar2;
  detail *this_01;
  char *pcVar3;
  string local_60;
  string local_40;
  
  this_00 = &(this->super_reporter).os;
  pbVar1 = std::function<std::basic_ostream<char,_std::char_traits<char>_>_&()>::operator()(this_00)
  ;
  *(undefined8 *)(pbVar1 + *(long *)(*(long *)pbVar1 + -0x18) + 8) = 7;
  pbVar1 = std::function<std::basic_ostream<char,_std::char_traits<char>_>_&()>::operator()(this_00)
  ;
  *(uint *)(pbVar1 + *(long *)(*(long *)pbVar1 + -0x18) + 0x18) =
       *(uint *)(pbVar1 + *(long *)(*(long *)pbVar1 + -0x18) + 0x18) & 0xfffffefb;
  pbVar1 = std::function<std::basic_ostream<char,_std::char_traits<char>_>_&()>::operator()(this_00)
  ;
  poVar2 = std::operator<<(pbVar1,name);
  this_01 = (detail *)0x20661f;
  poVar2 = std::operator<<(poVar2,": ");
  detail::pretty_duration_abi_cxx11_(&local_60,this_01,(fp_seconds)estimate.point.__r);
  std::operator<<(poVar2,(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  if (this->summary == false) {
    pbVar1 = std::function<std::basic_ostream<char,_std::char_traits<char>_>_&()>::operator()
                       (this_00);
    pcVar3 = ", lb ";
    poVar2 = std::operator<<(pbVar1,", lb ");
    detail::pretty_duration_abi_cxx11_
              (&local_60,(detail *)pcVar3,(fp_seconds)estimate.lower_bound.__r);
    poVar2 = std::operator<<(poVar2,(string *)&local_60);
    pcVar3 = ", ub ";
    poVar2 = std::operator<<(poVar2,", ub ");
    detail::pretty_duration_abi_cxx11_
              (&local_40,(detail *)pcVar3,(fp_seconds)estimate.upper_bound.__r);
    poVar2 = std::operator<<(poVar2,(string *)&local_40);
    poVar2 = std::operator<<(poVar2,", ci ");
    *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 8) = 3;
    std::ostream::_M_insert<double>(estimate.confidence_interval);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
  }
  pbVar1 = std::function<std::basic_ostream<char,_std::char_traits<char>_>_&()>::operator()(this_00)
  ;
  std::operator<<(pbVar1,"\n");
  return;
}

Assistant:

void print_statistic_estimate(const char* name, estimate<fp_seconds> estimate) {
            report_stream() << std::setprecision(7);
            report_stream().unsetf(std::ios::floatfield);
            report_stream() << name << ": " << detail::pretty_duration(estimate.point);
            if(!summary) {
                report_stream() << ", lb " << detail::pretty_duration(estimate.lower_bound)
                         << ", ub " << detail::pretty_duration(estimate.upper_bound)
                         << ", ci " << std::setprecision(3) << estimate.confidence_interval;
            }
            report_stream() << "\n";
        }